

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall Default::Action(Default *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  Statement *pSVar3;
  int iVar4;
  pointer pcVar5;
  compile_errcode cVar6;
  
  iVar4 = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar4 == 0) {
      iVar4 = 1;
      if (SVar1 != DEFAULT_SYM) {
        return -1;
      }
    }
    else {
      if (iVar4 != 1) {
        pSVar3 = (Statement *)operator_new(0x1e8);
        (pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172618;
        (pSVar3->m_output_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172510;
        (pSVar3->m_output_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_output_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_input_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172460;
        (pSVar3->m_return_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001724b8;
        (pSVar3->m_return_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_return_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172568;
        (pSVar3->m_assign_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_assign_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_assign_statement).m_identifier_name._M_dataplus._M_p =
             (pointer)&(pSVar3->m_assign_statement).m_identifier_name.field_2;
        cVar6 = 0;
        (pSVar3->m_assign_statement).m_identifier_name._M_string_length = 0;
        (pSVar3->m_assign_statement).m_identifier_name.field_2._M_local_buf[0] = '\0';
        (pSVar3->m_function_call).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172670;
        (pSVar3->m_function_call).m_value_argument_list.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001722a8;
        (pSVar3->m_function_call).m_value_argument_list.m_expression.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_function_call).m_value_argument_list.m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001726c8;
        (pSVar3->m_condition_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001725c0;
        (pSVar3->m_condition_statement).m_condition.m_expression.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_condition_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_condition_statement).m_bottom_label._M_dataplus._M_p =
             (pointer)&(pSVar3->m_condition_statement).m_bottom_label.field_2;
        (pSVar3->m_condition_statement).m_bottom_label._M_string_length = 0;
        (pSVar3->m_condition_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
        (pSVar3->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172720;
        (pSVar3->m_while_loop_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001725c0;
        (pSVar3->m_while_loop_statement).m_condition.m_expression.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_while_loop_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_while_loop_statement).m_top_label._M_dataplus._M_p =
             (pointer)&(pSVar3->m_while_loop_statement).m_top_label.field_2;
        (pSVar3->m_while_loop_statement).m_top_label._M_string_length = 0;
        (pSVar3->m_while_loop_statement).m_top_label.field_2._M_local_buf[0] = '\0';
        (pSVar3->m_while_loop_statement).m_bottom_label._M_dataplus._M_p =
             (pointer)&(pSVar3->m_while_loop_statement).m_bottom_label.field_2;
        (pSVar3->m_while_loop_statement).m_bottom_label._M_string_length = 0;
        (pSVar3->m_while_loop_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
        (pSVar3->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172778;
        (pSVar3->m_switch_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_001721f8;
        (pSVar3->m_switch_statement).m_expression.m_term.super_AnalysisInterface.
        _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172250;
        (pSVar3->m_switch_statement).m_switch_table.super_AnalysisInterface._vptr_AnalysisInterface
             = (_func_int **)&PTR_Parse_001727d0;
        (pSVar3->m_switch_statement).m_switch_table.m_switch_child_statement.super_AnalysisInterface
        ._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00172828;
        (pSVar3->m_switch_statement).m_default.super_AnalysisInterface._vptr_AnalysisInterface =
             (_func_int **)&PTR_Parse_00172880;
        (pSVar3->m_switch_statement).m_bottom_label._M_dataplus._M_p =
             (pointer)&(pSVar3->m_switch_statement).m_bottom_label.field_2;
        (pSVar3->m_switch_statement).m_bottom_label._M_string_length = 0;
        (pSVar3->m_switch_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
        this->m_statement_ptr = pSVar3;
        cVar2 = Statement::Action(pSVar3);
        pSVar3 = this->m_statement_ptr;
        if (cVar2 == 0) {
          (*(pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar3);
          pSVar3 = this->m_statement_ptr;
          if (pSVar3 == (Statement *)0x0) goto LAB_00131f3b;
          (pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172618;
          (pSVar3->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172778;
          pcVar5 = (pSVar3->m_switch_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_switch_statement).m_bottom_label.field_2) {
            operator_delete(pcVar5);
          }
          (pSVar3->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172720;
          pcVar5 = (pSVar3->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_while_loop_statement).m_bottom_label.field_2) {
            operator_delete(pcVar5);
          }
          pcVar5 = (pSVar3->m_while_loop_statement).m_top_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_while_loop_statement).m_top_label.field_2) {
            operator_delete(pcVar5);
          }
          (pSVar3->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001726c8;
          pcVar5 = (pSVar3->m_condition_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_condition_statement).m_bottom_label.field_2) {
            operator_delete(pcVar5);
          }
          (pSVar3->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172568;
          pcVar5 = (pSVar3->m_assign_statement).m_identifier_name._M_dataplus._M_p;
          cVar2 = 0;
          cVar6 = 0;
        }
        else {
          if (pSVar3 == (Statement *)0x0) {
            cVar6 = -1;
            goto LAB_00131f3b;
          }
          (pSVar3->super_AnalysisInterface)._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172618;
          (pSVar3->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172778;
          pcVar5 = (pSVar3->m_switch_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_switch_statement).m_bottom_label.field_2) {
            operator_delete(pcVar5);
          }
          (pSVar3->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172720;
          pcVar5 = (pSVar3->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_while_loop_statement).m_bottom_label.field_2) {
            operator_delete(pcVar5);
          }
          pcVar5 = (pSVar3->m_while_loop_statement).m_top_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_while_loop_statement).m_top_label.field_2) {
            operator_delete(pcVar5);
          }
          (pSVar3->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001726c8;
          pcVar5 = (pSVar3->m_condition_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pSVar3->m_condition_statement).m_bottom_label.field_2) {
            operator_delete(pcVar5);
          }
          (pSVar3->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00172568;
          pcVar5 = (pSVar3->m_assign_statement).m_identifier_name._M_dataplus._M_p;
          cVar2 = -1;
          cVar6 = -1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &(pSVar3->m_assign_statement).m_identifier_name.field_2) {
          operator_delete(pcVar5);
          cVar6 = cVar2;
        }
LAB_00131f3b:
        operator_delete(pSVar3);
        return cVar6;
      }
      iVar4 = 2;
      if (SVar1 != COLON_SYM) {
        return -1;
      }
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode Default::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}